

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_31e922::writeRead
          (anon_unknown_dwarf_31e922 *this,string *tempDir,int W,int H,Compression comp,int xSize,
          int ySize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  undefined4 *puVar10;
  Compression *pCVar11;
  Rgba *pRVar12;
  int *piVar13;
  void *pvVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  float *pfVar17;
  Rgba *pRVar18;
  ulong uVar19;
  ulong *puVar20;
  Rgba RVar21;
  void *pvVar22;
  Array2D<Imf_3_2::Rgba> *pAVar23;
  long lVar24;
  long lVar25;
  half *phVar26;
  Rgba RVar27;
  int xlevel;
  Rgba *pRVar28;
  ulong uVar29;
  Array2D<Imf_3_2::Rgba> *pAVar30;
  Array2D<Imf_3_2::Rgba> *pAVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  Array2D<Imf_3_2::Rgba> *pAVar39;
  long lVar40;
  undefined4 uVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  undefined1 auStack_208 [8];
  Rgba *local_200;
  Array2D<Imf_3_2::Rgba> *local_1f8;
  Array2D<Imf_3_2::Rgba> *local_1f0;
  Rgba *local_1e8;
  int local_1e0;
  int local_1dc;
  TiledRgbaOutputFile out;
  half hStack_1d6;
  half hStack_1d4;
  half hStack_1d2;
  void *local_178;
  Rgba *local_168;
  Array2D<Imf_3_2::Rgba> p3;
  Array2D<Imf_3_2::Rgba> p1;
  Header header;
  int local_c8;
  void *local_c0;
  Rgba *local_b8;
  long local_b0;
  Compression local_a8;
  Compression local_a0;
  undefined1 local_98 [8];
  long local_90;
  Rgba *local_88;
  int local_7c;
  string filename;
  
  local_1e8 = (Rgba *)CONCAT44(local_1e8._4_4_,xSize);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  local_1e0 = W;
  local_1dc = H;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,this,this + (long)&tempDir->_M_dataplus);
  std::__cxx11::string::append((char *)&filename);
  _Var4 = filename._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 0",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", compression ",0xe);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", tileSize ",0xb);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
  plVar9 = (long *)std::ostream::operator<<(poVar8,ySize);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  _out = 0;
  hStack_1d6._h = 0;
  hStack_1d4._h = 0;
  hStack_1d2._h = 0;
  Imf_3_2::Header::Header
            (&header,local_1e0,local_1dc,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar10 = (undefined4 *)Imf_3_2::Header::lineOrder();
  *puVar10 = 0;
  pCVar11 = (Compression *)Imf_3_2::Header::compression();
  *pCVar11 = comp;
  p1._sizeX = (long)local_1dc;
  lVar38 = (long)local_1e0;
  p1._sizeY = lVar38;
  pRVar12 = (Rgba *)operator_new__(-(ulong)((ulong)(p1._sizeX * lVar38) >> 0x3d != 0) |
                                   p1._sizeX * lVar38 * 8);
  p1._data = pRVar12;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
  std::ostream::flush();
  remove(_Var4._M_p);
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,_Var4._M_p,&header,WRITE_RGBA,(int)local_1e8,ySize,ONE_LEVEL,ROUND_DOWN,iVar5);
  fillPixels(&p1,local_1e0,local_1dc);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pRVar12,1);
  iVar5 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar6 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_2::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar5 + -1,0,iVar6 + -1);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var4._M_p,iVar5);
  piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  iVar6 = *piVar13;
  lVar33 = (long)piVar13[2] - (long)iVar6;
  uVar19 = lVar33 + 1;
  iVar7 = piVar13[1];
  uVar37 = piVar13[3] - iVar7;
  iVar5 = uVar37 + 1;
  uVar29 = 0xffffffffffffffff;
  if ((long)iVar5 * uVar19 < 0x2000000000000000) {
    uVar29 = (long)iVar5 * uVar19 * 8;
  }
  pvVar14 = operator_new__(uVar29);
  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(long)pvVar14 + (long)iVar6 * -8 + (long)-iVar7 * uVar19 * 8,1);
  iVar6 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&out);
  iVar7 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&out);
  uVar41 = 0;
  Imf_3_2::TiledRgbaInputFile::readTiles((int)&out,0,iVar6 + -1,0,iVar7 + -1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::ostream::flush();
  puVar15 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::displayWindow();
  puVar16 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar6 = -(uint)((int)*puVar16 == (int)*puVar15);
  iVar7 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
  auVar43._4_4_ = iVar6;
  auVar43._0_4_ = iVar6;
  auVar43._8_4_ = iVar7;
  auVar43._12_4_ = iVar7;
  iVar6 = movmskpd(uVar41,auVar43);
  if ((iVar6 != 3) ||
     (iVar7 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
     iVar55 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
     auVar44._4_4_ = iVar7, auVar44._0_4_ = iVar7, auVar44._8_4_ = iVar55, auVar44._12_4_ = iVar55,
     iVar7 = movmskpd((int)puVar16,auVar44), iVar7 != 3)) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x66,
                  "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  puVar15 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  puVar16 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar7 = -(uint)((int)*puVar16 == (int)*puVar15);
  iVar55 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
  auVar45._4_4_ = iVar7;
  auVar45._0_4_ = iVar7;
  auVar45._8_4_ = iVar55;
  auVar45._12_4_ = iVar55;
  iVar6 = movmskpd(iVar6,auVar45);
  if ((iVar6 != 3) ||
     (iVar6 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
     iVar7 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
     auVar46._4_4_ = iVar6, auVar46._0_4_ = iVar6, auVar46._8_4_ = iVar7, auVar46._12_4_ = iVar7,
     iVar6 = movmskpd((int)puVar16,auVar46), iVar6 != 3)) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x67,
                  "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  local_200._0_4_ = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
  pfVar17 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((local_200._0_4_ != *pfVar17) || (NAN(local_200._0_4_) || NAN(*pfVar17))) {
    __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x68,
                  "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
  pfVar17 = (float *)Imf_3_2::Header::screenWindowCenter();
  if (((float)p3._sizeX == *pfVar17) && (!NAN((float)p3._sizeX) && !NAN(*pfVar17))) {
    if ((p3._sizeX._4_4_ == pfVar17[1]) && (!NAN(p3._sizeX._4_4_) && !NAN(pfVar17[1]))) {
      uVar41 = Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
      local_200 = (Rgba *)CONCAT44(local_200._4_4_,uVar41);
      pfVar17 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((local_200._0_4_ != *pfVar17) || (NAN(local_200._0_4_) || NAN(*pfVar17))) {
        __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6a,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      iVar6 = Imf_3_2::TiledRgbaInputFile::lineOrder();
      piVar13 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar6 != *piVar13) {
        __assert_fail("in.lineOrder () == header.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6b,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      iVar6 = Imf_3_2::TiledRgbaInputFile::compression();
      piVar13 = (int *)Imf_3_2::Header::compression();
      if (iVar6 != *piVar13) {
        __assert_fail("in.compression () == header.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6c,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      iVar6 = Imf_3_2::TiledRgbaInputFile::channels();
      if (iVar6 != 0xf) {
        __assert_fail("in.channels () == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x6d,
                      "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      local_c8 = (int)lVar33;
      if (comp - B44_COMPRESSION < 4) {
        if (-1 < (int)uVar37) {
          local_a0 = comp & ~RLE_COMPRESSION;
          local_a8 = comp & (DWAA_COMPRESSION|B44_COMPRESSION);
          lVar24 = (long)(int)local_1e8;
          lVar33 = (long)ySize;
          local_b0 = 0;
          iVar6 = iVar5;
          local_c0 = pvVar14;
          local_b8 = pRVar12;
          do {
            iVar7 = iVar6;
            if (ySize < iVar6) {
              iVar7 = ySize;
            }
            local_7c = iVar6;
            if (-1 < local_c8) {
              iVar6 = iVar5 - (int)local_b0;
              if (ySize <= iVar5 - (int)local_b0) {
                iVar6 = ySize;
              }
              lVar34 = (long)iVar6;
              local_178 = local_c0;
              uVar29 = uVar19 & 0xffffffff;
              lVar25 = 0;
              pRVar28 = local_b8;
              do {
                iVar55 = (int)uVar29;
                local_1f0 = (Array2D<Imf_3_2::Rgba> *)CONCAT44(local_1f0._4_4_,iVar55);
                lVar32 = (long)iVar55;
                if (lVar24 < iVar55) {
                  lVar32 = lVar24;
                }
                iVar55 = (int)uVar19 - (int)lVar25;
                if ((int)local_1e8 <= iVar55) {
                  iVar55 = (int)local_1e8;
                }
                lVar40 = (long)iVar55;
                uVar29 = lVar40 * lVar34 * 8;
                if (0x1fffffffffffffff < (ulong)(lVar40 * lVar34)) {
                  uVar29 = 0xffffffffffffffff;
                }
                local_200 = pRVar28;
                local_1f8 = (Array2D<Imf_3_2::Rgba> *)lVar25;
                p3._sizeX = lVar34;
                p3._sizeY = lVar40;
                p3._data = (Rgba *)operator_new__(uVar29);
                local_98 = (undefined1  [8])lVar34;
                local_90 = lVar40;
                local_88 = (Rgba *)operator_new__(uVar29);
                pAVar39 = local_1f8;
                pRVar28 = local_200;
                if (0 < iVar6) {
                  lVar25 = 0;
                  lVar40 = 0;
                  pRVar18 = local_200;
                  pvVar22 = local_178;
                  do {
                    if (0 < iVar55) {
                      lVar35 = 0;
                      do {
                        *(Rgba *)((long)&p3._data[lVar35].r._h + p3._sizeY * lVar25) =
                             pRVar18[lVar35];
                        *(undefined8 *)((long)&local_88[lVar35].r._h + local_90 * lVar25) =
                             *(undefined8 *)((long)pvVar22 + lVar35 * 8);
                        lVar35 = lVar35 + 1;
                      } while (lVar32 != lVar35);
                    }
                    lVar40 = lVar40 + 1;
                    lVar25 = lVar25 + 8;
                    pvVar22 = (void *)((long)pvVar22 + uVar19 * 8);
                    pRVar18 = pRVar18 + lVar38;
                  } while (lVar40 != iVar7);
                }
                if (local_a0 == B44_COMPRESSION) {
                  compareB44(iVar55,iVar6,&p3,(Array2D<Imf_3_2::Rgba> *)local_98,WRITE_RGBA);
                  pAVar39 = local_1f8;
                }
                else if (local_a8 == DWAA_COMPRESSION) {
                  compareDwa(iVar55,iVar6,&p3,(Array2D<Imf_3_2::Rgba> *)local_98,WRITE_RGBA);
                }
                if (local_88 != (Rgba *)0x0) {
                  operator_delete__(local_88);
                }
                if (p3._data != (Rgba *)0x0) {
                  operator_delete__(p3._data);
                }
                lVar25 = (long)pAVar39 + lVar24;
                uVar29 = (ulong)(uint)((int)local_1f0 - (int)local_1e8);
                local_178 = (void *)((long)local_178 + lVar24 * 8);
                pRVar28 = pRVar28 + lVar24;
              } while (lVar25 <= local_c8);
            }
            local_b0 = local_b0 + lVar33;
            iVar6 = local_7c - ySize;
            local_c0 = (void *)((long)local_c0 + lVar33 * uVar19 * 8);
            local_b8 = local_b8 + lVar33 * lVar38;
          } while (local_b0 <= (long)(ulong)uVar37);
        }
      }
      else if (-1 < (int)uVar37) {
        phVar26 = &pRVar12->a;
        lVar33 = (long)pvVar14 + 6;
        uVar29 = 0;
        do {
          if (-1 < local_c8) {
            uVar36 = 0;
            do {
              fVar42 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar33 + -6 + uVar36 * 8) * 4);
              pfVar17 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar26[uVar36 * 4 + -3]._h * 4);
              if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x98,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              fVar42 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar33 + -4 + uVar36 * 8) * 4);
              pfVar17 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar26[uVar36 * 4 + -2]._h * 4);
              if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x9d,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              fVar42 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar33 + -2 + uVar36 * 8) * 4);
              pfVar17 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar26[uVar36 * 4 + -1]._h * 4);
              if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0xa2,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              fVar42 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar33 + uVar36 * 8) * 4);
              pfVar17 = (float *)(_imath_half_to_float_table + (ulong)phVar26[uVar36 * 4]._h * 4);
              if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0xa7,
                              "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              uVar36 = uVar36 + 1;
            } while ((uVar19 & 0xffffffff) != uVar36);
          }
          uVar29 = uVar29 + 1;
          phVar26 = phVar26 + lVar38 * 4;
          lVar33 = lVar33 + uVar19 * 8;
        } while (uVar29 != uVar37 + 1);
      }
      operator_delete__(pvVar14);
      Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
      remove(_Var4._M_p);
      operator_delete__(pRVar12);
      Imf_3_2::Header::~Header(&header);
      _Var4 = filename._M_dataplus;
      if (0xfffffffb < comp - NUM_COMPRESSION_METHODS) {
LAB_001b6f3a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 1",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", compression ",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", tileSize ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
      plVar9 = (long *)std::ostream::operator<<(poVar8,ySize);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      _out = 0;
      hStack_1d6._h = 0;
      hStack_1d4._h = 0;
      hStack_1d2._h = 0;
      Imf_3_2::Header::Header
                (&header,local_1e0,local_1dc,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      puVar10 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar10 = 0;
      pCVar11 = (Compression *)Imf_3_2::Header::compression();
      *pCVar11 = comp;
      p1._sizeX = 0;
      p1._sizeY = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var4._M_p);
      iVar5 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                (&out,_Var4._M_p,&header,WRITE_RGBA,(int)local_1e8,ySize,MIPMAP_LEVELS,ROUND_DOWN,
                 iVar5);
      iVar5 = Imf_3_2::TiledRgbaOutputFile::numLevels();
      uVar29 = (ulong)iVar5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar29;
      uVar19 = SUB168(auVar1 * ZEXT816(0x18),0);
      uVar36 = uVar19 + 8;
      if (0xfffffffffffffff7 < uVar19) {
        uVar36 = 0xffffffffffffffff;
      }
      if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
        uVar36 = 0xffffffffffffffff;
      }
      puVar20 = (ulong *)operator_new__(uVar36);
      *puVar20 = uVar29;
      if (iVar5 != 0) {
        memset(puVar20 + 1,0,((uVar19 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      local_1f0 = (Array2D<Imf_3_2::Rgba> *)_Var4._M_p;
      if (p1._sizeY != 0) {
        lVar33 = *(long *)(p1._sizeY + -8);
        pvVar14 = (void *)(p1._sizeY + -8);
        if (lVar33 != 0) {
          lVar38 = lVar33 * 0x18;
          do {
            pvVar22 = *(void **)((long)pvVar14 + lVar38);
            if (pvVar22 != (void *)0x0) {
              operator_delete__(pvVar22);
            }
            lVar38 = lVar38 + -0x18;
          } while (lVar38 != 0);
        }
        operator_delete__(pvVar14,lVar33 * 0x18 + 8);
      }
      local_200 = (Rgba *)0x0;
      lVar33 = 0;
      p1._sizeX = uVar29;
      p1._sizeY = (long)(puVar20 + 1);
      while (pAVar39 = local_1f0, iVar5 = Imf_3_2::TiledRgbaOutputFile::numLevels(), lVar33 < iVar5)
      {
        iVar7 = (int)(Rgba *)&out;
        iVar5 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar7);
        iVar6 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar7);
        lVar38 = p1._sizeY;
        uVar29 = (long)iVar6 * (long)iVar5;
        uVar19 = uVar29 * 8;
        if (0x1fffffffffffffff < uVar29) {
          uVar19 = 0xffffffffffffffff;
        }
        pvVar22 = operator_new__(uVar19);
        pvVar14 = *(void **)(lVar38 + 0x10 + (long)local_200);
        lVar24 = lVar38;
        local_1f8 = (Array2D<Imf_3_2::Rgba> *)lVar33;
        if (pvVar14 != (void *)0x0) {
          operator_delete__(pvVar14);
          lVar24 = p1._sizeY;
        }
        pRVar12 = local_200;
        *(long *)(lVar38 + (long)local_200) = (long)iVar6;
        *(long *)(lVar38 + 8 + (long)local_200) = (long)iVar5;
        *(void **)(lVar38 + 0x10 + (long)local_200) = pvVar22;
        fillPixels((Array2D<Imf_3_2::Rgba> *)(lVar24 + (long)local_200),iVar5,iVar6);
        Imf_3_2::TiledRgbaOutputFile::setFrameBuffer
                  ((Rgba *)&out,*(ulong *)(p1._sizeY + 0x10 + (long)pRVar12),1);
        pAVar39 = local_1f8;
        iVar5 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar7);
        iVar6 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar7);
        Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar7,0,iVar5 + -1,0,iVar6 + -1);
        local_200 = (Rgba *)((long)local_200 + 0x18);
        lVar33 = (long)pAVar39 + 1;
      }
      Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar5 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&out,(char *)pAVar39,iVar5);
      piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
      lVar33 = (long)*piVar13;
      iVar5 = piVar13[1];
      local_200 = (Rgba *)lVar33;
      uVar37 = Imf_3_2::TiledRgbaInputFile::numLevels();
      uVar41 = (undefined4)lVar33;
      Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::Array
                ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p3,(long)(int)uVar37);
      local_1f8 = (Array2D<Imf_3_2::Rgba> *)(ulong)uVar37;
      if (0 < (int)uVar37) {
        local_200 = (Rgba *)-(long)local_200;
        lVar33 = 0x10;
        uVar19 = 0;
        do {
          iVar7 = (int)auStack_208 + 0x30;
          iVar6 = Imf_3_2::TiledRgbaInputFile::levelWidth(iVar7);
          iVar7 = Imf_3_2::TiledRgbaInputFile::levelHeight(iVar7);
          lVar38 = p3._sizeY;
          uVar36 = (long)iVar7 * (long)iVar6;
          uVar29 = uVar36 * 8;
          if (0x1fffffffffffffff < uVar36) {
            uVar29 = 0xffffffffffffffff;
          }
          pvVar14 = operator_new__(uVar29);
          lVar24 = lVar38;
          if (*(void **)(lVar38 + lVar33) != (void *)0x0) {
            operator_delete__(*(void **)(lVar38 + lVar33));
            lVar24 = p3._sizeY;
          }
          *(long *)(lVar38 + -0x10 + lVar33) = (long)iVar7;
          *(long *)(lVar38 + -8 + lVar33) = (long)iVar6;
          *(void **)(lVar38 + lVar33) = pvVar14;
          Imf_3_2::TiledRgbaInputFile::setFrameBuffer
                    ((Rgba *)&out,
                     *(long *)(lVar24 + -8 + lVar33) * -(long)iVar5 * 8 + *(long *)(lVar24 + lVar33)
                     + (long)local_200 * 8,1);
          iVar6 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&out);
          iVar7 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&out);
          uVar41 = 0;
          Imf_3_2::TiledRgbaInputFile::readTiles((int)&out,0,iVar6 + -1,0,iVar7 + -1);
          uVar19 = uVar19 + 1;
          lVar33 = lVar33 + 0x18;
        } while (local_1f8 != (Array2D<Imf_3_2::Rgba> *)uVar19);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      puVar15 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::displayWindow();
      puVar16 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar5 = -(uint)((int)*puVar16 == (int)*puVar15);
      iVar6 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
      auVar47._4_4_ = iVar5;
      auVar47._0_4_ = iVar5;
      auVar47._8_4_ = iVar6;
      auVar47._12_4_ = iVar6;
      iVar5 = movmskpd(uVar41,auVar47);
      if ((iVar5 != 3) ||
         (iVar6 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
         iVar7 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
         auVar48._4_4_ = iVar6, auVar48._0_4_ = iVar6, auVar48._8_4_ = iVar7, auVar48._12_4_ = iVar7
         , iVar6 = movmskpd((int)puVar16,auVar48), iVar6 != 3)) {
        __assert_fail("in.displayWindow () == header.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x103,
                      "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      puVar15 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::dataWindow();
      puVar16 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar6 = -(uint)((int)*puVar16 == (int)*puVar15);
      iVar7 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
      auVar49._4_4_ = iVar6;
      auVar49._0_4_ = iVar6;
      auVar49._8_4_ = iVar7;
      auVar49._12_4_ = iVar7;
      iVar5 = movmskpd(iVar5,auVar49);
      if ((iVar5 != 3) ||
         (iVar5 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
         iVar6 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
         auVar50._4_4_ = iVar5, auVar50._0_4_ = iVar5, auVar50._8_4_ = iVar6, auVar50._12_4_ = iVar6
         , iVar5 = movmskpd((int)puVar16,auVar50), iVar5 != 3)) {
        __assert_fail("in.dataWindow () == header.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x104,
                      "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      fVar42 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
      local_200._0_4_ = fVar42;
      pfVar17 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((local_200._0_4_ != *pfVar17) || (NAN(local_200._0_4_) || NAN(*pfVar17))) {
        __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x105,
                      "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                     );
      }
      Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
      pfVar17 = (float *)Imf_3_2::Header::screenWindowCenter();
      if (((float)local_98._0_4_ == *pfVar17) && (!NAN((float)local_98._0_4_) && !NAN(*pfVar17))) {
        if (((float)local_98._4_4_ == pfVar17[1]) &&
           (!NAN((float)local_98._4_4_) && !NAN(pfVar17[1]))) {
          uVar41 = Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
          local_200 = (Rgba *)CONCAT44(local_200._4_4_,uVar41);
          pfVar17 = (float *)Imf_3_2::Header::screenWindowWidth();
          if ((local_200._0_4_ != *pfVar17) || (NAN(local_200._0_4_) || NAN(*pfVar17))) {
            __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x107,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          iVar5 = Imf_3_2::TiledRgbaInputFile::lineOrder();
          piVar13 = (int *)Imf_3_2::Header::lineOrder();
          if (iVar5 != *piVar13) {
            __assert_fail("in.lineOrder () == header.lineOrder ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x108,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          iVar5 = Imf_3_2::TiledRgbaInputFile::compression();
          piVar13 = (int *)Imf_3_2::Header::compression();
          if (iVar5 != *piVar13) {
            __assert_fail("in.compression () == header.compression ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x109,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          iVar5 = Imf_3_2::TiledRgbaInputFile::channels();
          if (iVar5 != 0xf) {
            __assert_fail("in.channels () == channels",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x10a,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          if (0 < (int)uVar37) {
            uVar19 = 0;
            do {
              lVar33 = uVar19 * 0x18;
              lVar24 = 0;
              lVar38 = 0;
              while( true ) {
                iVar5 = Imf_3_2::TiledRgbaInputFile::levelHeight((int)&out);
                if (iVar5 <= lVar38) break;
                lVar34 = 0;
                local_200 = (Rgba *)lVar38;
                while (iVar5 = Imf_3_2::TiledRgbaInputFile::levelWidth((int)&out), lVar34 < iVar5) {
                  lVar38 = *(long *)(p3._sizeY + 8 + lVar33) * lVar24 +
                           *(long *)(p3._sizeY + 0x10 + lVar33);
                  fVar42 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar38 + lVar34 * 8) * 4);
                  lVar25 = *(long *)(p1._sizeY + 8 + lVar33) * lVar24 +
                           *(long *)(p1._sizeY + 0x10 + lVar33);
                  pfVar17 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar25 + lVar34 * 8) * 4);
                  if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                    __assert_fail("(levels2[l])[y][x].r == (levels[l])[y][x].r",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x113,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                  fVar42 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar38 + 2 + lVar34 * 8) * 4);
                  pfVar17 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar25 + 2 + lVar34 * 8) * 4);
                  if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                    __assert_fail("(levels2[l])[y][x].g == (levels[l])[y][x].g",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x118,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                  fVar42 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar38 + 4 + lVar34 * 8) * 4);
                  pfVar17 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar25 + 4 + lVar34 * 8) * 4);
                  if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                    __assert_fail("(levels2[l])[y][x].b == (levels[l])[y][x].b",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x11d,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                  fVar42 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar38 + 6 + lVar34 * 8) * 4);
                  lVar38 = lVar34 * 8;
                  lVar34 = lVar34 + 1;
                  pfVar17 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar25 + 6 + lVar38) * 4);
                  if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                    __assert_fail("(levels2[l])[y][x].a == (levels[l])[y][x].a",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x122,
                                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                 );
                  }
                }
                lVar38 = (long)local_200 + 1;
                lVar24 = lVar24 + 8;
              }
              uVar19 = uVar19 + 1;
            } while ((Array2D<Imf_3_2::Rgba> *)uVar19 != local_1f8);
          }
          Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array
                    ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p3);
          Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
          remove((char *)local_1f0);
          Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array
                    ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p1);
          Imf_3_2::Header::~Header(&header);
          _Var4 = filename._M_dataplus;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"levelMode 2",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,", compression ",0xe);
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", tileSize ",0xb);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
          plVar9 = (long *)std::ostream::operator<<(poVar8,ySize);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          _out = 0;
          hStack_1d6._h = 0;
          hStack_1d4._h = 0;
          hStack_1d2._h = 0;
          Imf_3_2::Header::Header
                    (&header,local_1e0,local_1dc,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
          puVar10 = (undefined4 *)Imf_3_2::Header::lineOrder();
          *puVar10 = 0;
          pCVar11 = (Compression *)Imf_3_2::Header::compression();
          *pCVar11 = comp;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
          std::ostream::flush();
          remove(_Var4._M_p);
          iVar5 = Imf_3_2::globalThreadCount();
          Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                    (&out,_Var4._M_p,&header,WRITE_RGBA,(int)local_1e8,ySize,RIPMAP_LEVELS,ROUND_UP,
                     iVar5);
          iVar5 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
          iVar6 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
          lVar33 = (long)iVar6;
          uVar29 = iVar5 * lVar33;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar29;
          uVar19 = SUB168(auVar2 * ZEXT816(0x18),0);
          uVar36 = uVar19 + 8;
          if (0xfffffffffffffff7 < uVar19) {
            uVar36 = 0xffffffffffffffff;
          }
          if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
            uVar36 = 0xffffffffffffffff;
          }
          puVar20 = (ulong *)operator_new__(uVar36);
          *puVar20 = uVar29;
          pAVar39 = (Array2D<Imf_3_2::Rgba> *)(puVar20 + 1);
          if (uVar29 != 0) {
            memset(pAVar39,0,((uVar19 - 0x18) / 0x18) * 0x18 + 0x18);
          }
          local_1f0 = (Array2D<Imf_3_2::Rgba> *)(lVar33 * 0x18);
          local_200 = (Rgba *)0x0;
          local_1f8 = pAVar39;
          while (iVar5 = Imf_3_2::TiledRgbaOutputFile::numYLevels(), (long)local_200 < (long)iVar5)
          {
            pAVar23 = local_1f8;
            for (lVar38 = 0; iVar5 = Imf_3_2::TiledRgbaOutputFile::numXLevels(), lVar38 < iVar5;
                lVar38 = lVar38 + 1) {
              iVar7 = (int)(Rgba *)&out;
              iVar5 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar7);
              iVar6 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar7);
              uVar29 = (long)iVar6 * (long)iVar5;
              uVar19 = uVar29 * 8;
              if (0x1fffffffffffffff < uVar29) {
                uVar19 = 0xffffffffffffffff;
              }
              pRVar12 = (Rgba *)operator_new__(uVar19);
              if (pAVar23->_data != (Rgba *)0x0) {
                operator_delete__(pAVar23->_data);
              }
              pAVar23->_sizeX = (long)iVar6;
              pAVar23->_sizeY = (long)iVar5;
              pAVar23->_data = pRVar12;
              fillPixels(pAVar23,iVar5,iVar6);
              Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pAVar23->_data,1);
              iVar5 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar7);
              iVar6 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar7);
              Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar7,0,iVar5 + -1,0,iVar6 + -1,(int)lVar38);
              pAVar23 = pAVar23 + 1;
            }
            local_200 = (Rgba *)((long)local_200 + 1);
            local_1f8 = (Array2D<Imf_3_2::Rgba> *)((long)&local_1f8->_sizeX + (long)local_1f0);
          }
          Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
          std::ostream::flush();
          iVar5 = Imf_3_2::globalThreadCount();
          Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&out,_Var4._M_p,iVar5);
          piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
          local_1e8 = (Rgba *)(long)*piVar13;
          iVar5 = piVar13[1];
          uVar37 = Imf_3_2::TiledRgbaInputFile::numXLevels();
          iVar6 = Imf_3_2::TiledRgbaInputFile::numYLevels();
          local_1f0 = (Array2D<Imf_3_2::Rgba> *)CONCAT44(local_1f0._4_4_,iVar6);
          lVar38 = (long)(int)uVar37;
          RVar27 = (Rgba)(iVar6 * lVar38);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = RVar27;
          uVar19 = SUB168(auVar3 * ZEXT816(0x18),0);
          uVar29 = uVar19 + 8;
          pAVar23 = (Array2D<Imf_3_2::Rgba> *)0xffffffffffffffff;
          if (0xfffffffffffffff7 < uVar19) {
            uVar29 = 0xffffffffffffffff;
          }
          if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
            uVar29 = 0xffffffffffffffff;
          }
          local_200 = (Rgba *)operator_new__(uVar29);
          *local_200 = RVar27;
          pRVar12 = local_200 + 1;
          if (RVar27 != (Rgba)0x0) {
            pAVar23 = (Array2D<Imf_3_2::Rgba> *)0xaaaaaaaaaaaaaaab;
            memset(pRVar12,0,((uVar19 - 0x18) / 0x18) * 0x18 + 0x18);
          }
          pAVar30 = (Array2D<Imf_3_2::Rgba> *)((ulong)local_1f0 & 0xffffffff);
          pAVar31 = pAVar30;
          if (0 < (int)local_1f0) {
            local_1e8 = (Rgba *)-(long)local_1e8;
            local_168 = local_200 + 3;
            local_1f8 = (Array2D<Imf_3_2::Rgba> *)0x0;
            do {
              if (0 < (int)uVar37) {
                uVar19 = 0;
                pRVar28 = local_168;
                do {
                  iVar55 = (int)(Rgba *)&out;
                  iVar6 = Imf_3_2::TiledRgbaInputFile::levelWidth(iVar55);
                  iVar7 = Imf_3_2::TiledRgbaInputFile::levelHeight(iVar55);
                  RVar27 = (Rgba)(long)iVar6;
                  uVar36 = (long)iVar7 * (long)RVar27;
                  uVar29 = uVar36 * 8;
                  if (0x1fffffffffffffff < uVar36) {
                    uVar29 = 0xffffffffffffffff;
                  }
                  RVar21 = (Rgba)operator_new__(uVar29);
                  if (*pRVar28 != (Rgba)0x0) {
                    operator_delete__((void *)*pRVar28);
                  }
                  pRVar28[-2] = (Rgba)(long)iVar7;
                  pRVar28[-1] = RVar27;
                  *pRVar28 = RVar21;
                  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
                            ((Rgba *)&out,
                             (ulong)((long)((long)RVar27 * -(long)iVar5 * 8 + (long)RVar21) +
                                    (long)local_1e8 * 8),1);
                  iVar6 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar55);
                  iVar7 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar55);
                  Imf_3_2::TiledRgbaInputFile::readTiles
                            (iVar55,0,iVar6 + -1,0,iVar7 + -1,(int)uVar19);
                  uVar19 = uVar19 + 1;
                  pRVar28 = pRVar28 + 3;
                  pAVar31 = (Array2D<Imf_3_2::Rgba> *)((ulong)local_1f0 & 0xffffffff);
                } while (uVar37 != uVar19);
              }
              pAVar23 = (Array2D<Imf_3_2::Rgba> *)((long)&local_1f8->_sizeX + 1);
              local_168 = local_168 + lVar38 * 3;
              local_1f8 = pAVar23;
            } while (pAVar23 != pAVar30);
          }
          uVar41 = SUB84(pAVar23,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          std::ostream::flush();
          puVar15 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::displayWindow();
          puVar16 = (undefined8 *)Imf_3_2::Header::displayWindow();
          iVar5 = -(uint)((int)*puVar16 == (int)*puVar15);
          iVar6 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
          auVar51._4_4_ = iVar5;
          auVar51._0_4_ = iVar5;
          auVar51._8_4_ = iVar6;
          auVar51._12_4_ = iVar6;
          iVar5 = movmskpd(uVar41,auVar51);
          if ((iVar5 != 3) ||
             (iVar6 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
             iVar7 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
             auVar52._4_4_ = iVar6, auVar52._0_4_ = iVar6, auVar52._8_4_ = iVar7,
             auVar52._12_4_ = iVar7, iVar6 = movmskpd((int)puVar16,auVar52), iVar6 != 3)) {
            __assert_fail("in.displayWindow () == header.displayWindow ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x182,
                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          puVar15 = (undefined8 *)Imf_3_2::TiledRgbaInputFile::dataWindow();
          puVar16 = (undefined8 *)Imf_3_2::Header::dataWindow();
          iVar6 = -(uint)((int)*puVar16 == (int)*puVar15);
          iVar7 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
          auVar53._4_4_ = iVar6;
          auVar53._0_4_ = iVar6;
          auVar53._8_4_ = iVar7;
          auVar53._12_4_ = iVar7;
          iVar5 = movmskpd(iVar5,auVar53);
          if ((iVar5 != 3) ||
             (iVar5 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
             iVar6 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
             auVar54._4_4_ = iVar5, auVar54._0_4_ = iVar5, auVar54._8_4_ = iVar6,
             auVar54._12_4_ = iVar6, iVar5 = movmskpd((int)puVar16,auVar54), iVar5 != 3)) {
            __assert_fail("in.dataWindow () == header.dataWindow ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x183,
                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          fVar42 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
          local_1f8._0_4_ = fVar42;
          pfVar17 = (float *)Imf_3_2::Header::pixelAspectRatio();
          if ((local_1f8._0_4_ != *pfVar17) || (NAN(local_1f8._0_4_) || NAN(*pfVar17))) {
            __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x184,
                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
          Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
          pfVar17 = (float *)Imf_3_2::Header::screenWindowCenter();
          if (((float)p1._sizeX == *pfVar17) && (!NAN((float)p1._sizeX) && !NAN(*pfVar17))) {
            if ((p1._sizeX._4_4_ == pfVar17[1]) && (!NAN(p1._sizeX._4_4_) && !NAN(pfVar17[1]))) {
              uVar41 = Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
              local_1f8 = (Array2D<Imf_3_2::Rgba> *)CONCAT44(local_1f8._4_4_,uVar41);
              pfVar17 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((local_1f8._0_4_ != *pfVar17) || (NAN(local_1f8._0_4_) || NAN(*pfVar17))) {
                __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x186,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              iVar5 = Imf_3_2::TiledRgbaInputFile::lineOrder();
              piVar13 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar5 != *piVar13) {
                __assert_fail("in.lineOrder () == header.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x187,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              iVar5 = Imf_3_2::TiledRgbaInputFile::compression();
              piVar13 = (int *)Imf_3_2::Header::compression();
              if (iVar5 != *piVar13) {
                __assert_fail("in.compression () == header.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x188,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              iVar5 = Imf_3_2::TiledRgbaInputFile::channels();
              if (iVar5 != 0xf) {
                __assert_fail("in.channels () == channels",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x189,
                              "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                             );
              }
              if (0 < (int)pAVar31) {
                local_1f0 = (Array2D<Imf_3_2::Rgba> *)0x0;
                do {
                  if (0 < (int)uVar37) {
                    local_1e8 = pRVar12 + (long)local_1f0 * lVar38 * 3;
                    lVar24 = (long)local_1f0 * lVar33;
                    uVar19 = 0;
                    do {
                      pRVar28 = local_1e8;
                      lVar25 = 0;
                      lVar34 = 0;
                      while( true ) {
                        iVar5 = Imf_3_2::TiledRgbaInputFile::levelHeight((int)&out);
                        if (iVar5 <= lVar34) break;
                        lVar32 = 0;
                        local_1f8 = (Array2D<Imf_3_2::Rgba> *)lVar34;
                        while (iVar5 = Imf_3_2::TiledRgbaInputFile::levelWidth((int)&out),
                              lVar32 < iVar5) {
                          lVar34 = (long)pRVar28[uVar19 * 3 + 1] * lVar25 +
                                   (long)pRVar28[uVar19 * 3 + 2];
                          fVar42 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + lVar32 * 8) * 4);
                          lVar40 = pAVar39[lVar24 + uVar19]._sizeY * lVar25;
                          pRVar18 = pAVar39[lVar24 + uVar19]._data;
                          pfVar17 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)
                                                     ((long)&pRVar18[lVar32].r._h + lVar40) * 4);
                          if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                            __assert_fail("(levels2[ly][lx])[y][x].r == (levels[ly][lx])[y][x].r",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x196,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar42 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + 2 + lVar32 * 8) * 4);
                          pfVar17 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)
                                                     ((long)&pRVar18[lVar32].g._h + lVar40) * 4);
                          if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                            __assert_fail("(levels2[ly][lx])[y][x].g == (levels[ly][lx])[y][x].g",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x19d,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar42 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + 4 + lVar32 * 8) * 4);
                          pfVar17 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)
                                                     ((long)&pRVar18[lVar32].b._h + lVar40) * 4);
                          if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                            __assert_fail("(levels2[ly][lx])[y][x].b == (levels[ly][lx])[y][x].b",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x1a4,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar42 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar34 + 6 + lVar32 * 8) * 4);
                          pRVar18 = pRVar18 + lVar32;
                          lVar32 = lVar32 + 1;
                          pfVar17 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(uint16_t *)((long)&(pRVar18->a)._h + lVar40) *
                                             4);
                          if ((fVar42 != *pfVar17) || (NAN(fVar42) || NAN(*pfVar17))) {
                            __assert_fail("(levels2[ly][lx])[y][x].a == (levels[ly][lx])[y][x].a",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x1ab,
                                          "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                        }
                        lVar34 = (long)local_1f8 + 1;
                        lVar25 = lVar25 + 8;
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar19 != uVar37);
                  }
                  local_1f0 = (Array2D<Imf_3_2::Rgba> *)((long)&local_1f0->_sizeX + 1);
                } while (local_1f0 != pAVar30);
              }
              if (pRVar12 != (Rgba *)0x0) {
                if (*local_200 == (Rgba)0x0) {
                  uVar19 = 8;
                }
                else {
                  lVar33 = (long)*local_200 * 0x18;
                  lVar38 = lVar33;
                  do {
                    pvVar14 = *(void **)((long)&(local_200->r)._h + lVar38);
                    if (pvVar14 != (void *)0x0) {
                      operator_delete__(pvVar14);
                    }
                    lVar38 = lVar38 + -0x18;
                  } while (lVar38 != 0);
                  uVar19 = lVar33 + 8;
                }
                operator_delete__(local_200,uVar19);
              }
              Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
              remove(_Var4._M_p);
              if (pAVar39 != (Array2D<Imf_3_2::Rgba> *)0x0) {
                if (*puVar20 == 0) {
                  uVar19 = 8;
                }
                else {
                  lVar33 = *puVar20 * 0x18;
                  lVar38 = lVar33;
                  do {
                    if (*(void **)((long)puVar20 + lVar38) != (void *)0x0) {
                      operator_delete__(*(void **)((long)puVar20 + lVar38));
                    }
                    lVar38 = lVar38 + -0x18;
                  } while (lVar38 != 0);
                  uVar19 = lVar33 + 8;
                }
                operator_delete__(puVar20,uVar19);
              }
              Imf_3_2::Header::~Header(&header);
              goto LAB_001b6f3a;
            }
          }
          __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x185,
                        "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                       );
        }
      }
      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x106,
                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                   );
    }
  }
  __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                ,0x69,
                "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
               );
}

Assistant:

void
writeRead (
    const std::string& tempDir,
    int                W,
    int                H,
    Compression        comp,
    int                xSize,
    int                ySize)
{
    std::string filename = tempDir + "imf_test_tiled_rgba.exr";

    writeReadRGBAONE (filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

    if (comp != B44_COMPRESSION && comp != B44A_COMPRESSION &&
        comp != DWAA_COMPRESSION && comp != DWAB_COMPRESSION)
    {
        //
        // Skip mipmaps and ripmaps with B44 or DWA compression; writing
        // an image with a single resolution level, above, should be enough
        // to verify that B44 and DWA compression work with tiled files.
        //

        writeReadRGBAMIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

        writeReadRGBARIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);
    }
}